

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptorProto::SerializeWithCachedSizes
          (FileDescriptorProto *this,CodedOutputStream *output)

{
  char *data;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  uint uVar2;
  LogMessage *pLVar3;
  ulong uVar4;
  undefined8 *puVar5;
  FileOptions *value;
  SourceCodeInfo *value_00;
  long lVar6;
  LogFinisher local_69;
  LogMessage local_68;
  
  uVar2 = this->_has_bits_[0];
  if ((uVar2 & 1) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,SERIALIZE);
    internal::WireFormatLite::WriteString(1,this->name_,output);
    uVar2 = this->_has_bits_[0];
  }
  if ((uVar2 & 2) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->package_->_M_dataplus)._M_p,(int)this->package_->_M_string_length,SERIALIZE);
    internal::WireFormatLite::WriteString(2,this->package_,output);
  }
  uVar2 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
  uVar4 = (ulong)uVar2;
  if (0 < (int)uVar2) {
    lVar6 = 0;
    do {
      puVar5 = (undefined8 *)(this->dependency_).super_RepeatedPtrFieldBase.elements_[lVar6];
      data = (char *)*puVar5;
      if ((int)uVar4 <= lVar6) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_69,pLVar3);
        internal::LogMessage::~LogMessage(&local_68);
        puVar5 = (undefined8 *)(this->dependency_).super_RepeatedPtrFieldBase.elements_[lVar6];
      }
      internal::WireFormat::VerifyUTF8StringFallback(data,*(int *)(puVar5 + 1),SERIALIZE);
      if ((this->dependency_).super_RepeatedPtrFieldBase.current_size_ <= lVar6) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_69,pLVar3);
        internal::LogMessage::~LogMessage(&local_68);
      }
      internal::WireFormatLite::WriteString
                (3,(string *)(this->dependency_).super_RepeatedPtrFieldBase.elements_[lVar6],output)
      ;
      lVar6 = lVar6 + 1;
      uVar4 = (ulong)(this->dependency_).super_RepeatedPtrFieldBase.current_size_;
    } while (lVar6 < (long)uVar4);
  }
  if (0 < (this->message_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar6 = 0;
    do {
      internal::WireFormatLite::WriteMessageMaybeToArray
                (4,(MessageLite *)(this->message_type_).super_RepeatedPtrFieldBase.elements_[lVar6],
                 output);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->message_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (this->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar6 = 0;
    do {
      internal::WireFormatLite::WriteMessageMaybeToArray
                (5,(MessageLite *)(this->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar6],
                 output);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (this->service_).super_RepeatedPtrFieldBase.current_size_) {
    lVar6 = 0;
    do {
      internal::WireFormatLite::WriteMessageMaybeToArray
                (6,(MessageLite *)(this->service_).super_RepeatedPtrFieldBase.elements_[lVar6],
                 output);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->service_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (this->extension_).super_RepeatedPtrFieldBase.current_size_) {
    lVar6 = 0;
    do {
      internal::WireFormatLite::WriteMessageMaybeToArray
                (7,(MessageLite *)(this->extension_).super_RepeatedPtrFieldBase.elements_[lVar6],
                 output);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  uVar2 = this->_has_bits_[0];
  if ((uVar2 >> 9 & 1) != 0) {
    value = this->options_;
    if (value == (FileOptions *)0x0) {
      value = *(FileOptions **)(default_instance_ + 0xb8);
    }
    internal::WireFormatLite::WriteMessageMaybeToArray(8,(MessageLite *)value,output);
    uVar2 = this->_has_bits_[0];
  }
  if ((uVar2 >> 10 & 1) != 0) {
    value_00 = this->source_code_info_;
    if (value_00 == (SourceCodeInfo *)0x0) {
      value_00 = *(SourceCodeInfo **)(default_instance_ + 0xc0);
    }
    internal::WireFormatLite::WriteMessageMaybeToArray(9,(MessageLite *)value_00,output);
  }
  if (0 < (this->public_dependency_).current_size_) {
    lVar6 = 0;
    do {
      internal::WireFormatLite::WriteInt32(10,(this->public_dependency_).elements_[lVar6],output);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->public_dependency_).current_size_);
  }
  if (0 < (this->weak_dependency_).current_size_) {
    lVar6 = 0;
    do {
      internal::WireFormatLite::WriteInt32(0xb,(this->weak_dependency_).elements_[lVar6],output);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->weak_dependency_).current_size_);
  }
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    internal::WireFormat::SerializeUnknownFields(&this->_unknown_fields_,output);
  }
  return;
}

Assistant:

void FileDescriptorProto::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      1, this->name(), output);
  }

  // optional string package = 2;
  if (has_package()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->package().data(), this->package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      2, this->package(), output);
  }

  // repeated string dependency = 3;
  for (int i = 0; i < this->dependency_size(); i++) {
  ::google::protobuf::internal::WireFormat::VerifyUTF8String(
    this->dependency(i).data(), this->dependency(i).length(),
    ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      3, this->dependency(i), output);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (int i = 0; i < this->message_type_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      4, this->message_type(i), output);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (int i = 0; i < this->enum_type_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      5, this->enum_type(i), output);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (int i = 0; i < this->service_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      6, this->service(i), output);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (int i = 0; i < this->extension_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      7, this->extension(i), output);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if (has_options()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      8, this->options(), output);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if (has_source_code_info()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      9, this->source_code_info(), output);
  }

  // repeated int32 public_dependency = 10;
  for (int i = 0; i < this->public_dependency_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(
      10, this->public_dependency(i), output);
  }

  // repeated int32 weak_dependency = 11;
  for (int i = 0; i < this->weak_dependency_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(
      11, this->weak_dependency(i), output);
  }

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}